

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_gej *prej,secp256k1_fe *zr,secp256k1_gej *a)

{
  int local_15c;
  undefined1 local_158 [4];
  int i;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_gej d;
  secp256k1_gej *a_local;
  secp256k1_fe *zr_local;
  secp256k1_gej *prej_local;
  int n_local;
  
  d._120_8_ = a;
  secp256k1_gej_double_var((secp256k1_gej *)&a_ge.infinity,a,(secp256k1_fe *)0x0);
  memcpy(local_158,&a_ge.infinity,0x28);
  memcpy(d_ge.x.n + 4,d.x.n + 4,0x28);
  d_ge.y.n[4]._0_4_ = 0;
  secp256k1_ge_set_gej_zinv
            ((secp256k1_ge *)&d_ge.infinity,(secp256k1_gej *)d._120_8_,(secp256k1_fe *)(d.y.n + 4));
  memcpy(prej,&d_ge.infinity,0x28);
  memcpy(&prej->y,a_ge.x.n + 4,0x28);
  memcpy(&prej->z,(void *)(d._120_8_ + 0x50),0x28);
  prej->infinity = 0;
  memcpy(zr,d.y.n + 4,0x28);
  for (local_15c = 1; local_15c < n; local_15c = local_15c + 1) {
    secp256k1_gej_add_ge_var
              (prej + local_15c,prej + (local_15c + -1),(secp256k1_ge *)local_158,zr + local_15c);
  }
  secp256k1_fe_mul(&prej[n + -1].z,&prej[n + -1].z,(secp256k1_fe *)(d.y.n + 4));
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_gej *prej, secp256k1_fe *zr, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge a_ge, d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions on an isomorphism where 'd' is affine: drop the z coordinate
     * of 'd', and scale the 1P starting value's x/y coordinates without changing its z.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&a_ge, a, &d.z);
    prej[0].x = a_ge.x;
    prej[0].y = a_ge.y;
    prej[0].z = a->z;
    prej[0].infinity = 0;

    zr[0] = d.z;
    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&prej[i], &prej[i-1], &d_ge, &zr[i]);
    }

    /*
     * Each point in 'prej' has a z coordinate too small by a factor of 'd.z'. Only
     * the final point's z coordinate is actually used though, so just update that.
     */
    secp256k1_fe_mul(&prej[n-1].z, &prej[n-1].z, &d.z);
}